

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v10::detail::write_exponent<char,fmt::v10::appender>(int exp,appender it)

{
  char cVar1;
  long lVar2;
  ulong uVar3;
  
  if (0x4e1e < exp + 9999U) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/fmt/include/fmt/format.h"
                ,0x663,"exponent out of range");
  }
  uVar3 = *(long *)((long)it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                   0x10) + 1;
  if (exp < 0) {
    if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                  0x18) < uVar3) {
      (*(code *)**(undefined8 **)
                  it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
                (it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
    }
    lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                     + 0x10);
    *(long *)((long)it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container + 0x10)
         = lVar2 + 1;
    *(undefined1 *)
     (*(long *)((long)it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container + 8)
     + lVar2) = 0x2d;
    exp = -exp;
  }
  else {
    if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                  0x18) < uVar3) {
      (*(code *)**(undefined8 **)
                  it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
                (it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
    }
    lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                     + 0x10);
    *(long *)((long)it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container + 0x10)
         = lVar2 + 1;
    *(undefined1 *)
     (*(long *)((long)it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container + 8)
     + lVar2) = 0x2b;
  }
  if (99 < exp) {
    uVar3 = (ulong)(((uint)exp / 100) * 2);
    if (999 < exp) {
      cVar1 = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              [uVar3];
      if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                    + 0x18) <
          *(long *)((long)it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                   0x10) + 1U) {
        (*(code *)**(undefined8 **)
                    it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
                  (it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
      }
      lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                              container + 0x10);
      *(long *)((long)it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
               0x10) = lVar2 + 1;
      *(char *)(*(long *)((long)it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                container + 8) + lVar2) = cVar1;
    }
    cVar1 = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            [uVar3 + 1];
    if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                  0x18) <
        *(long *)((long)it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                 0x10) + 1U) {
      (*(code *)**(undefined8 **)
                  it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
                (it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
    }
    exp = (uint)exp % 100;
    lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                     + 0x10);
    *(long *)((long)it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container + 0x10)
         = lVar2 + 1;
    *(char *)(*(long *)((long)it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                              container + 8) + lVar2) = cVar1;
  }
  if (-1 < exp) {
    cVar1 = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            [(ulong)(uint)exp * 2];
    if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                  0x18) <
        *(long *)((long)it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                 0x10) + 1U) {
      (*(code *)**(undefined8 **)
                  it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
                (it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
    }
    lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                     + 0x10);
    *(long *)((long)it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container + 0x10)
         = lVar2 + 1;
    *(char *)(*(long *)((long)it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                              container + 8) + lVar2) = cVar1;
    cVar1 = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            [(ulong)(uint)exp * 2 + 1];
    if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                  0x18) <
        *(long *)((long)it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                 0x10) + 1U) {
      (*(code *)**(undefined8 **)
                  it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
                (it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
    }
    lVar2 = *(long *)((long)it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                     + 0x10);
    *(long *)((long)it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container + 0x10)
         = lVar2 + 1;
    *(char *)(*(long *)((long)it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                              container + 8) + lVar2) = cVar1;
    return (appender)
           it.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/fmt/include/fmt/core.h"
              ,0x17a,"negative value");
}

Assistant:

FMT_CONSTEXPR auto write_exponent(int exp, It it) -> It {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *it++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *it++ = static_cast<Char>('+');
  }
  if (exp >= 100) {
    const char* top = digits2(to_unsigned(exp / 100));
    if (exp >= 1000) *it++ = static_cast<Char>(top[0]);
    *it++ = static_cast<Char>(top[1]);
    exp %= 100;
  }
  const char* d = digits2(to_unsigned(exp));
  *it++ = static_cast<Char>(d[0]);
  *it++ = static_cast<Char>(d[1]);
  return it;
}